

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  Printer *this_00;
  bool bVar2;
  uint uVar3;
  CppType CVar4;
  Type TVar5;
  GeneratorOptions *options_00;
  char *pcVar6;
  string *psVar7;
  int i;
  int i_00;
  undefined1 in_R9B;
  undefined1 drop_list;
  BytesMode in_stack_fffffffffffffd60;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  byte local_173;
  allocator local_172;
  byte local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator local_129;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  GeneratorOptions *local_68;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  string local_48;
  GeneratorOptions *local_28;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  uVar3 = FieldDescriptor::number(field);
  psVar7 = &local_48;
  SimpleItoa_abi_cxx11_(psVar7,(protobuf *)(ulong)uVar3,i);
  io::Printer::Print(printer,"    case $num$:\n","num",psVar7);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = anon_unknown_0::IsMap((GeneratorOptions *)printer_local,(FieldDescriptor *)local_28);
  if (bVar2) {
    value_field = anon_unknown_0::MapFieldKey((FieldDescriptor *)local_28);
    local_68 = (GeneratorOptions *)anon_unknown_0::MapFieldValue((FieldDescriptor *)local_28);
    pFVar1 = field_local;
    psVar7 = &local_88;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar7,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
               BYTES_DEFAULT,(bool)in_R9B);
    io::Printer::Print((Printer *)pFVar1,
                       "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
                       ,"name",psVar7);
    std::__cxx11::string::~string((string *)&local_88);
    pFVar1 = field_local;
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field,
               (FieldDescriptor *)psVar7);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_c8,(_anonymous_namespace_ *)printer_local,local_68,(FieldDescriptor *)psVar7);
    psVar7 = &local_a8;
    io::Printer::Print((Printer *)pFVar1,
                       "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$"
                       ,"keyReaderFn",psVar7,"valueReaderFn",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)local_68);
    this_00 = printer_local;
    pFVar1 = field_local;
    if (TVar5 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type((FieldDescriptor *)local_68);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_e8,(_anonymous_namespace_ *)this_00,options_00,(Descriptor *)psVar7);
      io::Printer::Print((Printer *)pFVar1,", $messageType$.deserializeBinaryFromReader",
                         "messageType",&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    io::Printer::Print((Printer *)field_local,");\n");
    io::Printer::Print((Printer *)field_local,"         });\n");
  }
  else {
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)local_28);
    pFVar1 = field_local;
    if (CVar4 == CPPTYPE_MESSAGE) {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_108,(_anonymous_namespace_ *)printer_local,local_28,
                 (FieldDescriptor *)psVar7);
      TVar5 = FieldDescriptor::type((FieldDescriptor *)local_28);
      pcVar6 = "Message";
      if (TVar5 == TYPE_GROUP) {
        pcVar6 = "Group";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,pcVar6,&local_129);
      local_171 = 0;
      local_173 = 0;
      TVar5 = FieldDescriptor::type((FieldDescriptor *)local_28);
      if (TVar5 == TYPE_GROUP) {
        uVar3 = FieldDescriptor::number((FieldDescriptor *)local_28);
        SimpleItoa_abi_cxx11_(&local_170,(protobuf *)(ulong)uVar3,i_00);
        local_171 = 1;
        std::operator+(&local_150,&local_170,", ");
      }
      else {
        std::allocator<char>::allocator();
        local_173 = 1;
        std::__cxx11::string::string((string *)&local_150,"",&local_172);
      }
      psVar7 = &local_128;
      io::Printer::Print((Printer *)pFVar1,
                         "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                         ,"fieldclass",&local_108,"msgOrGroup",psVar7,"grpfield",&local_150);
      drop_list = SUB81(psVar7,0);
      std::__cxx11::string::~string((string *)&local_150);
      if ((local_173 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_172);
      }
      if ((local_171 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_170);
      }
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string((string *)&local_108);
    }
    else {
      bVar2 = false;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (&local_198,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
                 true,true,true,in_stack_fffffffffffffd60);
      (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
                (&local_1b8,(_anonymous_namespace_ *)local_28,(FieldDescriptor *)0x0,bVar2);
      psVar7 = &local_1b8;
      io::Printer::Print((Printer *)pFVar1,
                         "      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                         "fieldtype",&local_198,"reader",psVar7);
      drop_list = SUB81(psVar7,0);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_198);
    }
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)local_28);
    if ((!bVar2) ||
       (bVar2 = FieldDescriptor::is_packed((FieldDescriptor *)local_28), pFVar1 = field_local, bVar2
       )) {
      pFVar1 = field_local;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_1f8,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
                 BYTES_DEFAULT,(bool)drop_list);
      io::Printer::Print((Printer *)pFVar1,"      msg.set$name$(value);\n","name",&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    else {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_1d8,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
                 BYTES_B64,(bool)drop_list);
      io::Printer::Print((Printer *)pFVar1,"      msg.add$name$(value);\n","name",&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  io::Printer::Print((Printer *)field_local,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {

  printer->Print("    case $num$:\n",
                 "num", SimpleItoa(field->number()));

  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print("        jspb.Map.deserializeBinary(message, reader, "
                   "$keyReaderFn$, $valueReaderFn$",
          "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
          "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
        "fieldclass", SubmessageTypeRef(options, field),
          "msgOrGroup", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                        "Group" : "Message",
          "grpfield", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                      (SimpleItoa(field->number()) + ", ") : "");
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype", JSFieldTypeAnnotation(options, field, false, true,
                                             /* singular_if_not_packed */ true,
                                             BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_repeated() && !field->is_packed()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print(
          "      msg.set$name$(value);\n",
          "name", JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}